

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O2

void gen_ss_advance(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *tcg_ctx;
  
  if (s->ss_active == true) {
    tcg_ctx = s->uc->tcg_ctx;
    s->pstate_ss = false;
    clear_pstate_bits(tcg_ctx,0x200000);
    return;
  }
  return;
}

Assistant:

static inline void gen_ss_advance(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->ss_active) {
        s->pstate_ss = 0;
        clear_pstate_bits(tcg_ctx, PSTATE_SS);
    }
}